

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_prompt.hpp
# Opt level: O1

string * util::prompt(string *__return_storage_ptr__,string *__question,int __max_size)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__max_size < 1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    do {
      std::ostream::flush();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(__question->_M_dataplus)._M_p,
                          __question->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n>>> ",5);
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x68);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)__return_storage_ptr__,cVar2);
      iVar1 = (int)__return_storage_ptr__->_M_string_length;
    } while (__max_size < iVar1 || iVar1 < 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prompt(std::string __question, int __max_size = MAX_STRING_LENGTH)
	{
		if (__max_size <= 0)
			return "";

		std::string _out;
		int _out_length;
		do {
			std::cout.flush();
			std::cout << __question << "\n>>> ";
			std::getline(std::cin, _out);
			_out_length = _out.length();
		} while (_out_length <= 0 || _out_length > __max_size);

		return _out;
	}